

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall helics::apps::Echo::processArgs(Echo *this)

{
  helicsCLI11App app;
  allocator<char> local_44a;
  allocator<char> local_449;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  helicsCLI11App local_3a8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"Options specific to the Echo App",&local_44a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"",&local_449);
  helicsCLI11App::helicsCLI11App(&local_3a8,&local_3c8,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"--delay",(allocator<char> *)&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"the delay with which the echo app will echo message",&local_44a);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (&local_3a8.super_App,&local_3e8,&this->delayTime,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  if ((this->super_App).deactivated == false) {
    CLI::App::parse(&local_3a8.super_App,&(this->super_App).remArgs);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics(&local_3a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"",&local_44a);
    CLI::App::help(&local_448,&local_3a8.super_App,&local_428,Normal);
    std::operator<<((ostream *)&std::cout,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_428);
  }
  helicsCLI11App::~helicsCLI11App(&local_3a8);
  return;
}

Assistant:

void Echo::processArgs()
    {
        helicsCLI11App app("Options specific to the Echo App");
        app.add_option("--delay", delayTime, "the delay with which the echo app will echo message");
        if (!deactivated) {
            app.parse(remArgs);
        } else if (helpMode) {
            app.remove_helics_specifics();
            std::cout << app.help();
        }
    }